

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_explore.cc
# Opt level: O1

void CB_EXPLORE::get_cover_probabilities
               (cb_explore *data,single_learner *param_2,example *ec,
               v_array<ACTION_SCORE::action_score> *probs)

{
  uint64_t *puVar1;
  uint32_t uVar2;
  learner<CB_EXPLORE::cb_explore,_example> *plVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float fVar15;
  undefined4 in_XMM2_Db;
  action_score local_68;
  action_score *local_60;
  undefined8 local_58;
  pointer_____offset_0x10___ *local_40;
  action_score *local_38;
  undefined1 auVar14 [16];
  
  uVar4 = data->cover_size;
  local_58 = &data->preds;
  v_array<unsigned_int>::clear(local_58);
  if ((data->cbcs).num_actions != 0) {
    uVar6 = 0;
    do {
      local_68.score = 0.0;
      local_68.action = uVar6;
      v_array<ACTION_SCORE::action_score>::push_back(probs,&local_68);
      uVar6 = uVar6 + 1;
    } while (uVar6 < (data->cbcs).num_actions);
  }
  if (data->cover_size != 0) {
    uVar7 = 0;
    do {
      if (uVar7 == 0) {
        plVar3 = data->cs;
        (**(code **)(plVar3 + 0x30))
                  (*(undefined8 *)(plVar3 + 0x18),*(undefined8 *)(plVar3 + 0x20),ec);
      }
      else {
        plVar3 = data->cs;
        iVar8 = (int)uVar7 + 1;
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 + (ulong)(uint)(*(int *)(plVar3 + 0xe0) * iVar8);
        (**(code **)(plVar3 + 0x30))
                  (*(undefined8 *)(plVar3 + 0x18),*(undefined8 *)(plVar3 + 0x20),ec);
        puVar1 = &(ec->super_example_predict).ft_offset;
        *puVar1 = *puVar1 - (ulong)(uint)(iVar8 * *(int *)(plVar3 + 0xe0));
      }
      uVar2 = (ec->pred).multiclass;
      uVar6 = uVar2 - 1;
      probs->_begin[uVar6].score = probs->_begin[uVar6].score + 1.0 / (float)uVar4;
      local_68.action = uVar2;
      v_array<unsigned_int>::push_back(local_58,&local_68.action);
      uVar7 = uVar7 + 1;
    } while (uVar7 < data->cover_size);
  }
  uVar4 = (ulong)(data->cbcs).num_actions;
  fVar15 = (float)uVar4;
  lVar5 = uVar4 * data->counter;
  auVar12._8_4_ = (int)((ulong)lVar5 >> 0x20);
  auVar12._0_8_ = lVar5;
  auVar12._12_4_ = 0x45300000;
  dVar9 = (auVar12._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
  if (dVar9 < 0.0) {
    local_58 = (v_array<unsigned_int> *)CONCAT44(in_XMM2_Db,fVar15);
    dVar9 = sqrt(dVar9);
    fVar15 = (float)local_58;
    in_XMM2_Db = local_58._4_4_;
  }
  else {
    dVar9 = SQRT(dVar9);
  }
  auVar13._0_4_ = (float)dVar9;
  auVar14._4_8_ = 0;
  auVar14._0_4_ = auVar13._0_4_;
  auVar14._12_4_ = in_XMM2_Db;
  auVar13._8_8_ = auVar14._8_8_;
  auVar13._4_4_ = fVar15;
  auVar10 = divps(_DAT_0027ac30,auVar13);
  if (auVar10._4_4_ <= auVar10._0_4_) {
    auVar10._4_12_ = auVar10._4_12_;
    auVar10._0_4_ = auVar10._4_4_;
  }
  auVar11._4_12_ = auVar10._4_12_;
  auVar11._0_4_ = auVar10._0_4_ * fVar15;
  local_60 = probs->_begin;
  local_38 = probs->_end;
  local_68 = (action_score)
             &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  local_40 = &std::iterator<std::random_access_iterator_tag,float,long,float*,float>::typeinfo;
  exploration::enforce_minimum_probability<ACTION_SCORE::score_iterator>(auVar11._0_8_,0);
  data->counter = data->counter + 1;
  return;
}

Assistant:

void get_cover_probabilities(cb_explore& data, single_learner& /* base */, example& ec, v_array<action_score>& probs)
{
  float additive_probability = 1.f / (float)data.cover_size;
  data.preds.clear();

  for (uint32_t i = 0; i < data.cbcs.num_actions; i++) probs.push_back({i, 0.});

  for (size_t i = 0; i < data.cover_size; i++)
  {
    // get predicted cost-sensitive predictions
    if (i == 0)
      data.cs->predict(ec, i);
    else
      data.cs->predict(ec, i + 1);
    uint32_t pred = ec.pred.multiclass;
    probs[pred - 1].score += additive_probability;
    data.preds.push_back((uint32_t)pred);
  }
  uint32_t num_actions = data.cbcs.num_actions;

  float min_prob = min(1.f / num_actions, 1.f / (float)sqrt(data.counter * num_actions));

  enforce_minimum_probability(min_prob * num_actions, false, begin_scores(probs), end_scores(probs));

  data.counter++;
}